

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

ON_String __thiscall
ON_String::ToBIG5(ON_String *this,char *buffer,int buffer_length,int *error_count)

{
  bool bVar1;
  ON_Big5CodePoint OVar2;
  Encoding EVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ON_Big5UnicodePair key;
  ON_Big5UnicodePair pair;
  ON__UINT32 unicode_code_point;
  char *local_70;
  int local_68;
  int local_64;
  ON_String *local_60;
  uint local_58;
  int local_54;
  ON_SimpleArray<ON_Big5UnicodePair> *local_50;
  char *local_48;
  ON_UnicodeErrorParameters local_40;
  
  if (error_count != (int *)0x0) {
    *error_count = 0;
  }
  local_70 = buffer;
  if (buffer != (char *)0x0) {
    if (buffer_length == -1) {
      buffer_length = Length(buffer);
    }
    if (0 < buffer_length) {
      EVar3 = ProbableEncoding(local_70,buffer_length);
      if (EVar3 - UTF8 < 2) {
        local_50 = ON_Big5UnicodePair::UnicodeToBig5();
        ON_String(this);
        local_60 = this;
        local_48 = ReserveArray(this,(ulong)(buffer_length * 2 + 1));
        local_54 = buffer_length * 2;
        iVar8 = 0;
        local_68 = 0;
        local_64 = 0;
        uVar7 = 0;
        uVar9 = 0;
        while( true ) {
          this = local_60;
          if (buffer_length - uVar7 == 0 || buffer_length < (int)uVar7) break;
          local_40.m_error_status = ON_UnicodeErrorParameters::MaskErrors.m_error_status;
          local_40.m_error_mask = ON_UnicodeErrorParameters::MaskErrors.m_error_mask;
          local_40.m_error_code_point = 0x110000;
          unicode_code_point = 0x110000;
          iVar4 = ON_DecodeUTF8(local_70 + uVar7,buffer_length - uVar7,&local_40,&unicode_code_point
                               );
          pair = ON_Big5UnicodePair::Error;
          if ((0 < iVar4) && (bVar1 = ON_IsStandardUnicodeCodePoint(unicode_code_point), bVar1)) {
            if (unicode_code_point < 0x80) {
              pair = ON_Big5UnicodePair::Create(unicode_code_point,unicode_code_point);
            }
            else {
              key = ON_Big5UnicodePair::Create(0,unicode_code_point);
              local_58 = unicode_code_point;
              uVar5 = ON_Big5UnicodePair::UnicodeCodePoint(&key);
              if ((local_58 == uVar5) &&
                 (uVar5 = ON_SimpleArray<ON_Big5UnicodePair>::BinarySearch
                                    (local_50,&key,ON_Big5UnicodePair::CompareUnicodeCodePoint),
                 -1 < (int)uVar5)) {
                pair = local_50->m_a[uVar5];
              }
            }
          }
          bVar1 = ON_Big5UnicodePair::IsValid(&pair,true,true);
          if (bVar1) {
            OVar2 = ON_Big5UnicodePair::Big5(&pair);
            key.m_big5.m_big5_code_point = OVar2.m_big5_code_point;
            iVar6 = ON_Big5CodePoint::Encode
                              (&key.m_big5,local_48 + (int)uVar9,(long)(int)(local_54 - uVar9));
            if (1 < iVar6 - 1U) goto LAB_005c1e78;
            local_68 = local_68 + (uint)(iVar6 == 2);
          }
          else {
LAB_005c1e78:
            local_48[uVar9] = '?';
            local_64 = local_64 + 1;
            iVar6 = 1;
          }
          uVar9 = uVar9 + iVar6;
          if (iVar4 < 2) {
            iVar4 = 1;
          }
          uVar7 = uVar7 + iVar4;
          iVar8 = iVar8 + 1;
        }
        if ((0 < local_68) && (local_64 * 2 < iVar8)) {
          SetLength(local_60,(long)(int)uVar9);
          return (ON_String)(char *)this;
        }
        ~ON_String(local_60);
      }
      else if ((EVar3 == BIG5andASCII) || (EVar3 == ASCII)) {
        ON_String(this,local_70,buffer_length);
        return (ON_String)(char *)this;
      }
    }
  }
  ON_String(this,&EmptyString);
  return (ON_String)(char *)this;
}

Assistant:

const ON_String ON_String::ToBIG5(
  const char* buffer,
  int buffer_length,
  int* error_count
)
{
  if (nullptr != error_count)
    *error_count = 0;

  if (nullptr == buffer)
    return ON_String::EmptyString;

  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (buffer_length <= 0 || buffer_length > ON_String::MaximumStringLength)
    return ON_String::EmptyString;

  switch (ON_String::ProbableEncoding(buffer,buffer_length))
  {
  case ON_String::Encoding::ASCII:
  case ON_String::Encoding::BIG5andASCII:
    return ON_String(buffer,buffer_length);
    break;

  case ON_String::Encoding::UTF8:
  case ON_String::Encoding::SloppyUTF8:
  {
    const ON_SimpleArray< ON_Big5UnicodePair>& unicode_to_big5 = ON_Big5UnicodePair::UnicodeToBig5();

    const int big5_capacity = 2 * buffer_length;
    int big5_len = 0;
    ON_String big5;
    char* big5_buffer = big5.ReserveArray(big5_capacity + 1);

    int code_point_count = 0;
    int big5_code_point_count = 0;
    int fail_count = 0;
    int delta_i = 0;
    for (int i = 0; i < buffer_length; i += (delta_i > 0 ? delta_i : 1))
    {
      ON_UnicodeErrorParameters e = ON_UnicodeErrorParameters::MaskErrors;
      e.m_error_code_point = ON_UnicodeCodePoint::ON_InvalidCodePoint;
      ON__UINT32 unicode_code_point = e.m_error_code_point;
      delta_i = ON_DecodeUTF8(
        buffer + i,
        buffer_length - i,
        &e,
        &unicode_code_point
      );
      ++code_point_count;

      ON_Big5UnicodePair pair = ON_Big5UnicodePair::Error;
      for (;;)
      {
        if (delta_i <= 0)
          break;
        if (false == ON_IsStandardUnicodeCodePoint(unicode_code_point))
          break;

        if (unicode_code_point >= 0 && unicode_code_point <= 0x7F)
        {
          // ASCII code point.
          pair = ON_Big5UnicodePair::Create(unicode_code_point, unicode_code_point);
          break;
        }

        const ON_Big5UnicodePair key = ON_Big5UnicodePair::Create(0, unicode_code_point);
        if (unicode_code_point != key.UnicodeCodePoint())
          break;
        const int k = unicode_to_big5.BinarySearch(&key, ON_Big5UnicodePair::CompareUnicodeCodePoint);
        if (k < 0)
          break;

        // BIG5 code point
        pair = unicode_to_big5[k];
        break;
      }

      const int big5_delta = pair.IsValid(true, true) ? pair.Big5().Encode(big5_buffer + big5_len, big5_capacity - big5_len) : 0;
      if (1 == big5_delta || 2 == big5_delta)
      {
        if (2 == big5_delta)
          ++big5_code_point_count;
        big5_len += big5_delta;
      }
      else
      {
        big5_buffer[big5_len++] = '?';
        ++fail_count;
      }
    }
    if (big5_code_point_count > 0 && 2 * fail_count < code_point_count)
    {
      big5.SetLength(big5_len);
      return big5;
    }
  }
  break;

  default:
    break;
  }
  return ON_String::EmptyString;
}